

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seriot_suite.cpp
# Opt level: O1

void y_object_suite::y_object_escaped_null_in_key(void)

{
  reader reader;
  char input [21];
  undefined4 local_184;
  view_type local_180;
  basic_reader<char> local_170;
  char local_28 [24];
  
  builtin_strncpy(local_28,"{\"foo\\u0000bar\": 42}",0x15);
  local_180._M_len = strlen(local_28);
  local_180._M_str = local_28;
  trial::protocol::json::basic_reader<char>::basic_reader(&local_170,&local_180);
  local_184 = 0xe;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::begin_object",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xcd8,"void y_object_suite::y_object_escaped_null_in_key()",&local_180,&local_184);
  trial::protocol::json::basic_reader<char>::next(&local_170);
  local_180._M_len = CONCAT44(local_180._M_len._4_4_,local_170.decoder.current.code);
  local_184 = 0xb;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::key",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xcda,"void y_object_suite::y_object_escaped_null_in_key()",&local_180,&local_184);
  local_180._M_len =
       (long)local_170.decoder.current.view.tail - (long)local_170.decoder.current.view.head;
  local_180._M_str = local_170.decoder.current.view.head;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[15]>
            ("reader.literal()","\"\\\"foo\\\\u0000bar\\\"\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xcdb,"void y_object_suite::y_object_escaped_null_in_key()",&local_180,
             "\"foo\\u0000bar\"");
  trial::protocol::json::basic_reader<char>::next(&local_170);
  local_184 = 8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xcdd,"void y_object_suite::y_object_escaped_null_in_key()",&local_180,&local_184);
  local_180._M_len._0_4_ = trial::protocol::json::basic_reader<char>::value<int>(&local_170);
  local_184 = 0x2a;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("reader.value<int>()","42",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xcde,"void y_object_suite::y_object_escaped_null_in_key()",&local_180,&local_184);
  trial::protocol::json::basic_reader<char>::next(&local_170);
  local_184 = 0xf;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::end_object",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xce0,"void y_object_suite::y_object_escaped_null_in_key()",&local_180,&local_184);
  trial::protocol::json::basic_reader<char>::next(&local_170);
  local_180._M_len = CONCAT44(local_180._M_len._4_4_,local_170.decoder.current.code);
  local_184 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xce2,"void y_object_suite::y_object_escaped_null_in_key()",&local_180,&local_184);
  if (local_170.stack.c.
      super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_170.stack.c.
                    super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_170.stack.c.
                          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_170.stack.c.
                          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void y_object_escaped_null_in_key()
{
    const char input[] = "{\"foo\\u0000bar\": 42}";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::begin_object);
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::key);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.literal(), "\"foo\\u0000bar\"");
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::integer);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<int>(), 42);
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end_object);
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end);
}